

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O3

void demo::Tracing::ReverseTrace(Tracing *tracer,Formatter *formatter)

{
  Tracing *tracer_00;
  pointer pcVar1;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (formatter != (Formatter *)0x0) {
    if (tracer != (Tracing *)0x0) {
      tracer_00 = (tracer->cross_and_capture_to_).capture_to_.previous_;
      ReverseTrace(tracer_00,formatter);
      if (tracer_00 != (Tracing *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)formatter,":",1);
      }
      pcVar1 = (tracer->name_)._M_dataplus._M_p;
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,pcVar1,pcVar1 + (tracer->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)formatter,local_38,local_30);
      if (local_38 != local_28) {
        operator_delete(local_38);
      }
    }
    return;
  }
  __assert_fail("formatter",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/demo/tracing.cc"
                ,0x23,"static void demo::Tracing::ReverseTrace(const Tracing *, Formatter *)");
}

Assistant:

void Tracing::ReverseTrace(const Tracing* tracer, Formatter* formatter) {
  assert(formatter);
  if (tracer) {
    const auto previous = tracer->cross_and_capture_to_.Previous();
    ReverseTrace(previous, formatter);
    if (previous) {
      *formatter << ":";
    }
    *formatter << tracer->name();
  }
}